

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  int iVar1;
  pointer pnVar2;
  pointer pnVar3;
  undefined8 uVar4;
  int32_t iVar5;
  undefined8 uVar6;
  int iVar7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  DataKey DVar9;
  int *piVar10;
  pointer pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  pointer pnVar14;
  devexpr *pdVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  long lVar18;
  ulong uVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_2f4;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  fpclass_type local_240;
  int32_t iStack_23c;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar20 = 0;
  DVar9.info = 0;
  DVar9.idx = -1;
  pSVar8 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar8->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar8->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  local_268 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  uStack_24b = 0;
  lVar18 = (long)(pSVar8->infeasibilitiesCo).super_IdxSet.num;
  if (0 < lVar18) {
    uVar19 = lVar18 + 1;
    local_2f4 = -1;
    do {
      pSVar8 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar10 = (pSVar8->infeasibilitiesCo).super_IdxSet.idx;
      iVar1 = piVar10[uVar19 - 2];
      pnVar11 = pnVar2 + iVar1;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
      }
      iStack_248 = pnVar2[iVar1].m_backend.exp;
      bStack_244 = pnVar2[iVar1].m_backend.neg;
      local_240 = pnVar2[iVar1].m_backend.fpclass;
      iStack_23c = pnVar2[iVar1].m_backend.prec_elem;
      pnVar12 = feastol;
      pcVar13 = &local_230;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
      }
      local_230.exp = (feastol->m_backend).exp;
      local_230.neg = (feastol->m_backend).neg;
      local_230.fpclass = (feastol->m_backend).fpclass;
      local_230.prec_elem = (feastol->m_backend).prec_elem;
      if (local_230.data._M_elems[0] != 0 || local_230.fpclass != cpp_dec_float_finite) {
        local_230.neg = (bool)(local_230.neg ^ 1);
      }
      if (local_240 == cpp_dec_float_NaN || local_230.fpclass == cpp_dec_float_NaN) {
LAB_005a2f10:
        iVar7 = (pSVar8->infeasibilitiesCo).super_IdxSet.num;
        (pSVar8->infeasibilitiesCo).super_IdxSet.num = iVar7 + -1;
        piVar10[uVar19 - 2] = piVar10[(long)iVar7 + -1];
        (pSVar8->isInfeasibleCo).data[iVar1] = 0;
        uVar6 = _local_240;
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_2b8,&local_230);
        if (-1 < iVar7) {
          pSVar8 = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          piVar10 = (pSVar8->infeasibilitiesCo).super_IdxSet.idx;
          goto LAB_005a2f10;
        }
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
        pdVar15 = local_b0;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          *(uint *)pdVar15 = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
          pdVar15 = pdVar15 + (ulong)bVar20 * -8 + 4;
        }
        local_40 = iStack_248;
        local_3c = bStack_244;
        local_38 = local_240;
        iStack_34 = iStack_23c;
        pnVar11 = pnVar3 + iVar1;
        pnVar14 = pnVar11;
        pnVar12 = &local_130;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar3[iVar1].m_backend.exp;
        local_130.m_backend.neg = pnVar3[iVar1].m_backend.neg;
        local_130.m_backend.fpclass = pnVar3[iVar1].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar3[iVar1].m_backend.prec_elem;
        pnVar12 = feastol;
        pnVar16 = &local_1b0;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar20 * -2 + 1) * 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_230,local_b0,&local_130,&local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b0);
        pcVar13 = &local_230;
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar20 * -8 + 4);
        }
        iStack_248 = local_230.exp;
        bStack_244 = local_230.neg;
        uVar4._0_4_ = local_230.fpclass;
        uVar4._4_4_ = local_230.prec_elem;
        local_240 = local_230.fpclass;
        iStack_23c = local_230.prec_elem;
        uVar6 = _local_240;
        if (((local_230.fpclass != cpp_dec_float_NaN) &&
            (uVar6 = uVar4, (best->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_2b8,&best->m_backend),
           uVar6 = _local_240, 0 < iVar7)) {
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
          pnVar12 = best;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar20 * -8 + 4);
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          (best->m_backend).exp = iStack_248;
          (best->m_backend).neg = bStack_244;
          (best->m_backend).fpclass = local_240;
          (best->m_backend).prec_elem = iStack_23c;
          pnVar14 = pnVar11;
          pnVar12 = &this->last;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
            pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + (ulong)bVar20 * -8 + 4);
          }
          (this->last).m_backend.exp = (pnVar11->m_backend).exp;
          (this->last).m_backend.neg = (pnVar11->m_backend).neg;
          iVar5 = (pnVar11->m_backend).prec_elem;
          (this->last).m_backend.fpclass = (pnVar11->m_backend).fpclass;
          (this->last).m_backend.prec_elem = iVar5;
          local_2f4 = iVar1;
        }
      }
      _local_240 = uVar6;
      uVar19 = uVar19 - 1;
    } while (1 < uVar19);
    DVar9.info = 0;
    DVar9.idx = -1;
    if (-1 < local_2f4) {
      DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::id((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,local_2f4);
    }
  }
  return (SPxId)DVar9;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}